

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::declareBlock
          (HlslParseContext *this,TSourceLoc *loc,TType *type,TString *instanceName)

{
  _Rb_tree_header *p_Var1;
  TTypeList *typeList;
  TSymbolTable *pTVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  _Base_ptr p_Var7;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  pointer pTVar8;
  TQualifier *pTVar9;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  TString *n;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  TPoolAllocator *pTVar10;
  TString *name;
  TVariable *this_00;
  undefined4 extraout_var_23;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  _Base_ptr p_Var14;
  ulong uVar15;
  char *pcVar16;
  ulong uVar17;
  TSourceLoc *pTVar18;
  TQualifier *pTVar19;
  TType *pTVar20;
  HlslParseContext *pHVar21;
  _func_int **pp_Var22;
  _Rb_tree_header *p_Var23;
  TTypeList *pTVar24;
  byte bVar25;
  TType blockType;
  bool local_144;
  TQualifier local_138;
  TString *local_e8;
  TSourceLoc *local_e0;
  uint local_d8;
  ulong local_d0;
  TType local_c8;
  undefined4 extraout_var_14;
  undefined4 extraout_var_20;
  
  bVar25 = 0;
  iVar4 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar4 == '\0') {
LAB_0038684d:
    __assert_fail("isStruct()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                  ,0x9e1,"TTypeList *glslang::TType::getWritableStruct() const");
  }
  if ((type->field_13).structure == (TTypeList *)0x0) {
    __assert_fail("type.getWritableStruct() != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                  ,0x224e,
                  "void glslang::HlslParseContext::declareBlock(const TSourceLoc &, TType &, const TString *)"
                 );
  }
  iVar4 = (*type->_vptr_TType[10])(type);
  uVar5 = *(uint *)(CONCAT44(extraout_var,iVar4) + 8) & 0x7f;
  if (uVar5 - 5 < 2) {
    iVar4 = (*type->_vptr_TType[10])(type);
    lVar12 = CONCAT44(extraout_var_01,iVar4);
    uVar17 = *(ulong *)(lVar12 + 8);
    uVar11 = 0;
    if ((uVar17 & 0x1ff0000) == 0) {
      uVar11 = (ulong)(((uint)uVar17 & 0xff80) << 9);
    }
    *(ulong *)(lVar12 + 8) = uVar17 & 0xffffc01f1fff007f | uVar11;
    *(ulong *)(lVar12 + 0x1c) = *(ulong *)(lVar12 + 0x1c) & 0xffffffff8000 | 0xffff000000004fff;
    *(uint *)(lVar12 + 0x24) = *(uint *)(lVar12 + 0x24) | 0x7fffffff;
  }
  else if (uVar5 == 3) {
    iVar4 = (*type->_vptr_TType[10])(type);
    correctInput(this,(TQualifier *)CONCAT44(extraout_var_02,iVar4));
  }
  else if (uVar5 == 4) {
    iVar4 = (*type->_vptr_TType[10])(type);
    correctOutput(this,(TQualifier *)CONCAT44(extraout_var_00,iVar4));
  }
  local_e8 = instanceName;
  local_e0 = loc;
  iVar4 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar4 == '\0') goto LAB_0038684d;
  typeList = (type->field_13).structure;
  pTVar8 = (typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar8) {
    p_Var1 = &(this->ioTypeMap).
              super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    uVar17 = 0;
    do {
      pTVar20 = pTVar8[uVar17].type;
      iVar4 = (*pTVar20->_vptr_TType[10])(pTVar20);
      lVar12 = CONCAT44(extraout_var_03,iVar4);
      uVar5 = (uint)*(ulong *)(lVar12 + 8) & 0x7f;
      if (uVar5 == 0x10) {
        uVar11 = 3;
LAB_003861b0:
        *(ulong *)(lVar12 + 8) = *(ulong *)(lVar12 + 8) & 0xffffffffffffff80 | uVar11;
      }
      else if (uVar5 == 0x11) {
        uVar11 = 4;
        goto LAB_003861b0;
      }
      iVar4 = (*type->_vptr_TType[10])(type);
      *(ulong *)(lVar12 + 8) =
           *(ulong *)(lVar12 + 8) & 0xffffffffffffff80 |
           (ulong)((uint)*(undefined8 *)(CONCAT44(extraout_var_04,iVar4) + 8) & 0x7f);
      iVar4 = (*pTVar20->_vptr_TType[0x25])(pTVar20);
      if ((char)iVar4 != '\0') {
        iVar4 = (*pTVar20->_vptr_TType[0x25])(pTVar20);
        if ((char)iVar4 == '\0') {
          __assert_fail("isStruct()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                        ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
        }
        p_Var14 = (this->ioTypeMap).
                  super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var23 = p_Var1;
        if (p_Var14 != (_Base_ptr)0x0) {
          pTVar24 = (pTVar20->field_13).structure;
          p_Var7 = &p_Var1->_M_header;
          do {
            if (*(TTypeList **)(p_Var14 + 1) >= pTVar24) {
              p_Var7 = p_Var14;
            }
            p_Var14 = (&p_Var14->_M_left)[*(TTypeList **)(p_Var14 + 1) < pTVar24];
          } while (p_Var14 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
             (p_Var23 = (_Rb_tree_header *)p_Var7,
             pTVar24 < (TTypeList *)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
            p_Var23 = p_Var1;
          }
        }
        iVar4 = (*type->_vptr_TType[10])(type);
        uVar5 = *(uint *)(CONCAT44(extraout_var_05,iVar4) + 8) & 0x7f;
        if (uVar5 - 5 < 2) {
          iVar4 = (*type->_vptr_TType[10])(type);
          lVar12 = CONCAT44(extraout_var_07,iVar4);
          uVar11 = *(ulong *)(lVar12 + 8);
          uVar15 = (ulong)(((uint)uVar11 & 0xff80) << 9);
          if ((uVar11 & 0x1ff0000) != 0) {
            uVar15 = 0;
          }
          *(ulong *)(lVar12 + 8) = uVar11 & 0xffffc01f1fff007f | uVar15;
          *(ulong *)(lVar12 + 0x1c) =
               *(ulong *)(lVar12 + 0x1c) & 0xffffffff8000 | 0xffff000000004fff;
          *(uint *)(lVar12 + 0x24) = *(uint *)(lVar12 + 0x24) | 0x7fffffff;
          if (p_Var23 != p_Var1) {
            pTVar24 = *(TTypeList **)((long)(p_Var23 + 1) + 0x10);
LAB_0038632e:
            if (pTVar24 != (TTypeList *)0x0) {
              iVar4 = (*pTVar20->_vptr_TType[0x25])(pTVar20);
              if ((char)iVar4 == '\0') {
                __assert_fail("isStruct()",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                              ,0x9e0,"void glslang::TType::setStruct(TTypeList *)");
              }
              (pTVar20->field_13).structure = pTVar24;
            }
          }
        }
        else if (uVar5 == 3) {
          iVar4 = (*type->_vptr_TType[10])(type);
          correctInput(this,(TQualifier *)CONCAT44(extraout_var_08,iVar4));
          if (p_Var23 != p_Var1) {
            pTVar24 = *(TTypeList **)(p_Var23 + 1);
            goto LAB_0038632e;
          }
        }
        else if (uVar5 == 4) {
          iVar4 = (*type->_vptr_TType[10])(type);
          correctOutput(this,(TQualifier *)CONCAT44(extraout_var_06,iVar4));
          if (p_Var23 != p_Var1) {
            pTVar24 = *(TTypeList **)((long)(p_Var23 + 1) + 8);
            goto LAB_0038632e;
          }
        }
      }
      uVar17 = (ulong)((int)uVar17 + 1);
      pTVar8 = (typeList->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)((long)(typeList->
                                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                    ).
                                    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8 >> 5))
    ;
  }
  iVar4 = (*type->_vptr_TType[10])(type);
  switch(*(uint *)(CONCAT44(extraout_var_09,iVar4) + 8) & 0x7f) {
  case 3:
    pTVar9 = &this->globalInputDefaults;
    break;
  case 4:
    pTVar9 = &this->globalOutputDefaults;
    break;
  case 5:
    pTVar9 = &this->globalUniformDefaults;
    break;
  case 6:
    pTVar9 = &this->globalBufferDefaults;
    break;
  default:
    local_138.semanticName = (char *)0x0;
    local_138._8_8_ = 0;
    local_138._16_1_ = 0;
    local_138.layoutOffset = -1;
    local_138.layoutAlign = -1;
    local_138.layoutPushConstant = false;
    local_138.layoutBufferReference = false;
    local_138.layoutPassthrough = false;
    local_138.layoutViewportRelative = false;
    local_138.layoutSecondaryViewportRelativeOffset = -0x800;
    local_138.layoutBindlessSampler = false;
    local_138.layoutBindlessImage = false;
    local_138.layoutShaderRecord = false;
    local_138.layoutFullQuads = false;
    local_138.layoutQuadDeriv = false;
    local_138.layoutHitObjectShaderRecordNV = false;
    local_138._44_1_ = 0;
    local_138._28_8_ = 0xffffffff001fcfff;
    local_138._36_8_ = 0xffffffffffffffff;
    local_138.spirvStorageClass = -1;
    local_138.spirvDecorate = (TSpirvDecorate *)0x0;
    goto LAB_003863c9;
  }
  pTVar19 = &local_138;
  for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
    pTVar19->semanticName = pTVar9->semanticName;
    pTVar9 = (TQualifier *)((long)pTVar9 + (ulong)bVar25 * -0x10 + 8);
    pTVar19 = (TQualifier *)((long)pTVar19 + ((ulong)bVar25 * -2 + 1) * 8);
  }
LAB_003863c9:
  iVar4 = (*type->_vptr_TType[10])(type);
  if ((*(char *)(CONCAT44(extraout_var_10,iVar4) + 0x2d) == '\x01') &&
     (iVar4 = (*type->_vptr_TType[10])(type),
     (*(byte *)(CONCAT44(extraout_var_11,iVar4) + 0x10) & 0xf) == 0)) {
    iVar4 = (*type->_vptr_TType[10])(type);
    *(byte *)(CONCAT44(extraout_var_12,iVar4) + 0x10) =
         *(byte *)(CONCAT44(extraout_var_12,iVar4) + 0x10) & 0xf0 | 3;
  }
  pHVar21 = (HlslParseContext *)type;
  iVar4 = (*type->_vptr_TType[10])();
  uVar5 = 1;
  mergeObjectLayoutQualifiers(pHVar21,&local_138,(TQualifier *)CONCAT44(extraout_var_13,iVar4),true)
  ;
  pTVar8 = (typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
      super__Vector_impl_data._M_finish == pTVar8) {
    local_144 = false;
    bVar3 = false;
  }
  else {
    local_d0 = local_138._28_8_;
    _local_d8 = local_138._36_8_;
    bVar3 = false;
    uVar17 = 0;
    local_144 = false;
    do {
      iVar4 = (*(pTVar8[uVar17].type)->_vptr_TType[10])();
      pTVar9 = (TQualifier *)CONCAT44(extraout_var_14,iVar4);
      pTVar18 = &(typeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar17].loc;
      if (((char)(*(ulong *)&pTVar9->field_0x1c >> 0x38) != -1) &&
         ((*(ulong *)&pTVar9->field_0x1c ^ local_d0) >> 0x38 != 0)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar18,"member cannot contradict block","stream","");
      }
      uVar6 = (uint)*(undefined8 *)&pTVar9->field_0x24;
      if (((~uVar6 & 0xf) != 0) && (((uVar6 ^ local_d8) & 0xf) != 0)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar18,
                   "member cannot contradict block (or what block inherited from global)",
                   "xfb_buffer","");
      }
      if ((~*(uint *)&pTVar9->field_0x1c & 0xfff) == 0) {
        local_144 = true;
      }
      else {
        iVar4 = (*type->_vptr_TType[10])(type);
        bVar3 = (bool)(bVar3 | (*(uint *)(CONCAT44(extraout_var_15,iVar4) + 8) & 0x7f) - 3 < 2);
      }
      pTVar19 = &local_138;
      pTVar20 = &local_c8;
      for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
        pTVar20->_vptr_TType = (_func_int **)pTVar19->semanticName;
        pTVar19 = (TQualifier *)((long)pTVar19 + ((ulong)bVar25 * -2 + 1) * 8);
        pTVar20 = (TType *)((long)pTVar20 + (ulong)bVar25 * -0x10 + 8);
      }
      mergeQualifiers(this,(TQualifier *)&local_c8,pTVar9);
      pTVar20 = &local_c8;
      for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
        pTVar9->semanticName = (char *)pTVar20->_vptr_TType;
        pTVar20 = (TType *)((long)pTVar20 + (ulong)bVar25 * -0x10 + 8);
        pTVar9 = (TQualifier *)((long)pTVar9 + (ulong)bVar25 * -0x10 + 8);
      }
      uVar17 = (ulong)uVar5;
      pTVar8 = (typeList->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = uVar5 + 1;
    } while (uVar17 < (ulong)((long)(typeList->
                                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                    ).
                                    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8 >> 5))
    ;
  }
  iVar4 = (*type->_vptr_TType[10])(type);
  pTVar18 = local_e0;
  fixBlockLocations(this,local_e0,(TQualifier *)CONCAT44(extraout_var_16,iVar4),typeList,bVar3,
                    local_144);
  iVar4 = (*type->_vptr_TType[10])(type);
  fixXfbOffsets(this,(TQualifier *)CONCAT44(extraout_var_17,iVar4),typeList);
  iVar4 = (*type->_vptr_TType[10])(type);
  fixBlockUniformOffsets(this,(TQualifier *)CONCAT44(extraout_var_18,iVar4),typeList);
  pHVar21 = (HlslParseContext *)type;
  iVar4 = (*type->_vptr_TType[10])();
  mergeObjectLayoutQualifiers(pHVar21,(TQualifier *)CONCAT44(extraout_var_19,iVar4),&local_138,true)
  ;
  name = local_e8;
  if ((local_e8 == (TString *)0x0) || (n = local_e8, local_e8->_M_string_length == 0)) {
    iVar4 = (*type->_vptr_TType[5])(type);
    n = (TString *)CONCAT44(extraout_var_20,iVar4);
  }
  iVar4 = (*type->_vptr_TType[10])(type);
  TType::TType(&local_c8,typeList,n,(TQualifier *)CONCAT44(extraout_var_21,iVar4));
  iVar4 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar4 != '\0') {
    iVar4 = (*type->_vptr_TType[0x14])(type);
    local_c8.arraySizes = (TArraySizes *)CONCAT44(extraout_var_22,iVar4);
  }
  if (name == (TString *)0x0) {
    pTVar10 = GetThreadPoolAllocator();
    name = (TString *)TPoolAllocator::allocate(pTVar10,0x28);
    pTVar10 = GetThreadPoolAllocator();
    (name->_M_dataplus).super_allocator_type.allocator = pTVar10;
    (name->_M_dataplus)._M_p = (pointer)&name->field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)name,"");
  }
  pTVar10 = GetThreadPoolAllocator();
  this_00 = (TVariable *)TPoolAllocator::allocate(pTVar10,0xf8);
  TVariable::TVariable(this_00,name,name,&local_c8,false);
  bVar3 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_00);
  if (bVar3) {
    pTVar2 = (this->super_TParseContextBase).symbolTable;
    if ((int)((ulong)((long)(pTVar2->table).
                            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pTVar2->table).
                           super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) < 5) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                (this,this_00);
    }
  }
  else {
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(name,"");
    if (iVar4 == 0) {
      pp_Var22 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar16 = "nameless block contains a member that already has a name at global scope";
      pcVar13 = "";
    }
    else {
      iVar4 = (*(this_00->super_TSymbol)._vptr_TSymbol[3])(this_00);
      pcVar13 = *(char **)(CONCAT44(extraout_var_23,iVar4) + 8);
      pp_Var22 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar16 = "block instance name redefinition";
    }
    (*pp_Var22[0x2d])(this,pTVar18,pcVar16,pcVar13,"");
  }
  return;
}

Assistant:

void HlslParseContext::declareBlock(const TSourceLoc& loc, TType& type, const TString* instanceName)
{
    assert(type.getWritableStruct() != nullptr);

    // Clean up top-level decorations that don't belong.
    switch (type.getQualifier().storage) {
    case EvqUniform:
    case EvqBuffer:
        correctUniform(type.getQualifier());
        break;
    case EvqVaryingIn:
        correctInput(type.getQualifier());
        break;
    case EvqVaryingOut:
        correctOutput(type.getQualifier());
        break;
    default:
        break;
    }

    TTypeList& typeList = *type.getWritableStruct();
    // fix and check for member storage qualifiers and types that don't belong within a block
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TType& memberType = *typeList[member].type;
        TQualifier& memberQualifier = memberType.getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;
        globalQualifierFix(memberLoc, memberQualifier);
        memberQualifier.storage = type.getQualifier().storage;

        if (memberType.isStruct()) {
            // clean up and pick up the right set of decorations
            auto it = ioTypeMap.find(memberType.getStruct());
            switch (type.getQualifier().storage) {
            case EvqUniform:
            case EvqBuffer:
                correctUniform(type.getQualifier());
                if (it != ioTypeMap.end() && it->second.uniform)
                    memberType.setStruct(it->second.uniform);
                break;
            case EvqVaryingIn:
                correctInput(type.getQualifier());
                if (it != ioTypeMap.end() && it->second.input)
                    memberType.setStruct(it->second.input);
                break;
            case EvqVaryingOut:
                correctOutput(type.getQualifier());
                if (it != ioTypeMap.end() && it->second.output)
                    memberType.setStruct(it->second.output);
                break;
            default:
                break;
            }
        }
    }

    // Make default block qualification, and adjust the member qualifications

    TQualifier defaultQualification;
    switch (type.getQualifier().storage) {
    case EvqUniform:    defaultQualification = globalUniformDefaults;    break;
    case EvqBuffer:     defaultQualification = globalBufferDefaults;     break;
    case EvqVaryingIn:  defaultQualification = globalInputDefaults;      break;
    case EvqVaryingOut: defaultQualification = globalOutputDefaults;     break;
    default:            defaultQualification.clear();                    break;
    }

    // Special case for "push_constant uniform", which has a default of std430,
    // contrary to normal uniform defaults, and can't have a default tracked for it.
    if (type.getQualifier().layoutPushConstant && ! type.getQualifier().hasPacking())
        type.getQualifier().layoutPacking = ElpStd430;

    // fix and check for member layout qualifiers

    mergeObjectLayoutQualifiers(defaultQualification, type.getQualifier(), true);

    bool memberWithLocation = false;
    bool memberWithoutLocation = false;
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;
        if (memberQualifier.hasStream()) {
            if (defaultQualification.layoutStream != memberQualifier.layoutStream)
                error(memberLoc, "member cannot contradict block", "stream", "");
        }

        // "This includes a block's inheritance of the
        // current global default buffer, a block member's inheritance of the block's
        // buffer, and the requirement that any *xfb_buffer* declared on a block
        // member must match the buffer inherited from the block."
        if (memberQualifier.hasXfbBuffer()) {
            if (defaultQualification.layoutXfbBuffer != memberQualifier.layoutXfbBuffer)
                error(memberLoc, "member cannot contradict block (or what block inherited from global)", "xfb_buffer", "");
        }

        if (memberQualifier.hasLocation()) {
            switch (type.getQualifier().storage) {
            case EvqVaryingIn:
            case EvqVaryingOut:
                memberWithLocation = true;
                break;
            default:
                break;
            }
        } else
            memberWithoutLocation = true;

        TQualifier newMemberQualification = defaultQualification;
        mergeQualifiers(newMemberQualification, memberQualifier);
        memberQualifier = newMemberQualification;
    }

    // Process the members
    fixBlockLocations(loc, type.getQualifier(), typeList, memberWithLocation, memberWithoutLocation);
    fixXfbOffsets(type.getQualifier(), typeList);
    fixBlockUniformOffsets(type.getQualifier(), typeList);

    // reverse merge, so that currentBlockQualifier now has all layout information
    // (can't use defaultQualification directly, it's missing other non-layout-default-class qualifiers)
    mergeObjectLayoutQualifiers(type.getQualifier(), defaultQualification, true);

    //
    // Build and add the interface block as a new type named 'blockName'
    //

    // Use the instance name as the interface name if one exists, else the block name.
    const TString& interfaceName = (instanceName && !instanceName->empty()) ? *instanceName : type.getTypeName();

    TType blockType(&typeList, interfaceName, type.getQualifier());
    if (type.isArray())
        blockType.transferArraySizes(type.getArraySizes());

    // Add the variable, as anonymous or named instanceName.
    // Make an anonymous variable if no name was provided.
    if (instanceName == nullptr)
        instanceName = NewPoolTString("");

    TVariable& variable = *new TVariable(instanceName, blockType);
    if (! symbolTable.insert(variable)) {
        if (*instanceName == "")
            error(loc, "nameless block contains a member that already has a name at global scope",
                  "" /* blockName->c_str() */, "");
        else
            error(loc, "block instance name redefinition", variable.getName().c_str(), "");

        return;
    }

    // Save it in the AST for linker use.
    if (symbolTable.atGlobalLevel())
        trackLinkage(variable);
}